

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void PredictorSub11_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint uVar1;
  uint uVar3;
  ulong uVar2;
  uint uVar4;
  uint uVar6;
  ulong uVar5;
  __m128i res;
  __m128i pred;
  __m128i B;
  __m128i A;
  __m128i mask;
  __m128i pb;
  __m128i pa;
  __m128i src;
  __m128i TL;
  __m128i T;
  __m128i L;
  int i;
  longlong local_178 [2];
  longlong local_168 [2];
  undefined8 local_158;
  undefined8 uStack_150;
  longlong local_148;
  longlong lStack_140;
  longlong local_138;
  longlong lStack_130;
  ulong local_128;
  ulong uStack_120;
  int local_10c;
  long local_108;
  int local_fc;
  long local_f8;
  long local_f0;
  undefined8 *local_e8;
  longlong *local_e0;
  longlong *local_d8;
  ulong *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_108 = in_RCX;
  local_fc = in_EDX;
  local_f8 = in_RSI;
  local_f0 = in_RDI;
  for (local_10c = 0; local_10c + 4 <= local_fc; local_10c = local_10c + 4) {
    local_d0 = (ulong *)(local_f0 + (long)(local_10c + -1) * 4);
    local_128 = *local_d0;
    uStack_120 = local_d0[1];
    local_d8 = (longlong *)(local_f8 + (long)local_10c * 4);
    local_138 = *local_d8;
    lStack_130 = local_d8[1];
    local_e0 = (longlong *)(local_f8 + (long)(local_10c + -1) * 4);
    local_148 = *local_e0;
    lStack_140 = local_e0[1];
    local_e8 = (undefined8 *)(local_f0 + (long)local_10c * 4);
    local_158 = *local_e8;
    uStack_150 = local_e8[1];
    GetSumAbsDiff32_SSE2((__m128i *)&local_138,(__m128i *)&local_148,&local_168);
    GetSumAbsDiff32_SSE2((__m128i *)&local_128,(__m128i *)&local_148,&local_178);
    local_38 = (int)local_178[0];
    iStack_34 = (int)((ulong)local_178[0] >> 0x20);
    iStack_30 = (int)local_178[1];
    iStack_2c = (int)((ulong)local_178[1] >> 0x20);
    local_48 = (int)local_168[0];
    iStack_44 = (int)((ulong)local_168[0] >> 0x20);
    iStack_40 = (int)local_168[1];
    iStack_3c = (int)((ulong)local_168[1] >> 0x20);
    uVar1 = -(uint)(local_48 < local_38);
    uVar3 = -(uint)(iStack_44 < iStack_34);
    uVar4 = -(uint)(iStack_40 < iStack_30);
    uVar6 = -(uint)(iStack_3c < iStack_2c);
    local_78 = CONCAT44(uVar3,uVar1);
    uStack_70 = CONCAT44(uVar6,uVar4);
    local_88 = local_128;
    uStack_80 = uStack_120;
    local_58 = local_78 & local_128;
    uStack_50 = uStack_70 & uStack_120;
    local_18 = CONCAT44(uVar3,uVar1);
    uStack_10 = CONCAT44(uVar6,uVar4);
    local_28._0_4_ = (uint)local_138;
    local_28._4_4_ = (uint)((ulong)local_138 >> 0x20);
    uStack_20._0_4_ = (uint)lStack_130;
    uStack_20._4_4_ = (uint)((ulong)lStack_130 >> 0x20);
    local_68 = CONCAT44((uVar3 ^ 0xffffffff) & local_28._4_4_,(uVar1 ^ 0xffffffff) & (uint)local_28)
    ;
    uStack_60 = CONCAT44((uVar6 ^ 0xffffffff) & uStack_20._4_4_,
                         (uVar4 ^ 0xffffffff) & (uint)uStack_20);
    uVar2 = local_58 | local_68;
    uVar5 = uStack_50 | uStack_60;
    local_b8._0_1_ = (char)local_158;
    local_b8._1_1_ = (char)((ulong)local_158 >> 8);
    local_b8._2_1_ = (char)((ulong)local_158 >> 0x10);
    local_b8._3_1_ = (char)((ulong)local_158 >> 0x18);
    local_b8._4_1_ = (char)((ulong)local_158 >> 0x20);
    local_b8._5_1_ = (char)((ulong)local_158 >> 0x28);
    local_b8._6_1_ = (char)((ulong)local_158 >> 0x30);
    local_b8._7_1_ = (char)((ulong)local_158 >> 0x38);
    uStack_b0._0_1_ = (char)uStack_150;
    uStack_b0._1_1_ = (char)((ulong)uStack_150 >> 8);
    uStack_b0._2_1_ = (char)((ulong)uStack_150 >> 0x10);
    uStack_b0._3_1_ = (char)((ulong)uStack_150 >> 0x18);
    uStack_b0._4_1_ = (char)((ulong)uStack_150 >> 0x20);
    uStack_b0._5_1_ = (char)((ulong)uStack_150 >> 0x28);
    uStack_b0._6_1_ = (char)((ulong)uStack_150 >> 0x30);
    uStack_b0._7_1_ = (char)((ulong)uStack_150 >> 0x38);
    local_c8._0_1_ = (char)uVar2;
    local_c8._1_1_ = (char)(uVar2 >> 8);
    local_c8._2_1_ = (char)(uVar2 >> 0x10);
    local_c8._3_1_ = (char)(uVar2 >> 0x18);
    local_c8._4_1_ = (char)(uVar2 >> 0x20);
    local_c8._5_1_ = (char)(uVar2 >> 0x28);
    local_c8._6_1_ = (char)(uVar2 >> 0x30);
    local_c8._7_1_ = (char)(uVar2 >> 0x38);
    uStack_c0._0_1_ = (char)uVar5;
    uStack_c0._1_1_ = (char)(uVar5 >> 8);
    uStack_c0._2_1_ = (char)(uVar5 >> 0x10);
    uStack_c0._3_1_ = (char)(uVar5 >> 0x18);
    uStack_c0._4_1_ = (char)(uVar5 >> 0x20);
    uStack_c0._5_1_ = (char)(uVar5 >> 0x28);
    uStack_c0._6_1_ = (char)(uVar5 >> 0x30);
    uStack_c0._7_1_ = (char)(uVar5 >> 0x38);
    local_90 = (undefined8 *)(local_108 + (long)local_10c * 4);
    local_a8 = CONCAT17(local_b8._7_1_ - local_c8._7_1_,
                        CONCAT16(local_b8._6_1_ - local_c8._6_1_,
                                 CONCAT15(local_b8._5_1_ - local_c8._5_1_,
                                          CONCAT14(local_b8._4_1_ - local_c8._4_1_,
                                                   CONCAT13(local_b8._3_1_ - local_c8._3_1_,
                                                            CONCAT12(local_b8._2_1_ - local_c8._2_1_
                                                                     ,CONCAT11(local_b8._1_1_ -
                                                                               local_c8._1_1_,
                                                                               (char)local_b8 -
                                                                               (char)local_c8)))))))
    ;
    uStack_a0 = CONCAT17(uStack_b0._7_1_ - uStack_c0._7_1_,
                         CONCAT16(uStack_b0._6_1_ - uStack_c0._6_1_,
                                  CONCAT15(uStack_b0._5_1_ - uStack_c0._5_1_,
                                           CONCAT14(uStack_b0._4_1_ - uStack_c0._4_1_,
                                                    CONCAT13(uStack_b0._3_1_ - uStack_c0._3_1_,
                                                             CONCAT12(uStack_b0._2_1_ -
                                                                      uStack_c0._2_1_,
                                                                      CONCAT11(uStack_b0._1_1_ -
                                                                               uStack_c0._1_1_,
                                                                               (char)uStack_b0 -
                                                                               (char)uStack_c0))))))
                        );
    *local_90 = local_a8;
    local_90[1] = uStack_a0;
    local_c8 = uVar2;
    uStack_c0 = uVar5;
    local_b8 = local_158;
    uStack_b0 = uStack_150;
    local_28 = local_138;
    uStack_20 = lStack_130;
  }
  if (local_10c != local_fc) {
    (*VP8LPredictorsSub_C[0xb])
              ((uint32_t *)(local_f0 + (long)local_10c * 4),
               (uint32_t *)(local_f8 + (long)local_10c * 4),local_fc - local_10c,
               (uint32_t *)(local_108 + (long)local_10c * 4));
  }
  return;
}

Assistant:

static void PredictorSub11_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i pa, pb;
    GetSumAbsDiff32_SSE2(&T, &TL, &pa);   // pa = sum |T-TL|
    GetSumAbsDiff32_SSE2(&L, &TL, &pb);   // pb = sum |L-TL|
    {
      const __m128i mask = _mm_cmpgt_epi32(pb, pa);
      const __m128i A = _mm_and_si128(mask, L);
      const __m128i B = _mm_andnot_si128(mask, T);
      const __m128i pred = _mm_or_si128(A, B);    // pred = (L > T)? L : T
      const __m128i res = _mm_sub_epi8(src, pred);
      _mm_storeu_si128((__m128i*)&out[i], res);
    }
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[11](in + i, upper + i, num_pixels - i, out + i);
  }
}